

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O1

float __thiscall
baryonyx::itm::quadratic_cost_type<float>::operator()
          (quadratic_cost_type<float> *this,int index,bit_array *x)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  quad *pqVar5;
  long lVar6;
  uint uVar7;
  float fVar8;
  
  lVar6 = (long)index;
  piVar4 = (this->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
           super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl;
  fVar8 = (this->linear_elements)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
          _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
          super__Head_base<0UL,_float_*,_false>._M_head_impl[lVar6];
  iVar1 = piVar4[lVar6];
  iVar2 = piVar4[lVar6 + 1];
  if (iVar2 != iVar1) {
    pqVar5 = (this->quadratic_elements)._M_t.
             super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<float>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
             .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_false>.
             _M_head_impl;
    lVar6 = 0;
    do {
      uVar3 = pqVar5[iVar1 + lVar6].id;
      uVar7 = uVar3 + 0x3f;
      if (-1 < (int)uVar3) {
        uVar7 = uVar3;
      }
      if (((x->super_bit_array_impl).m_data._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl[(int)uVar7 >> 6] >>
           ((ulong)uVar3 & 0x3f) & 1) != 0) {
        fVar8 = fVar8 + pqVar5[iVar1 + lVar6].factor;
      }
      lVar6 = lVar6 + 1;
    } while (iVar2 - iVar1 != (int)lVar6);
  }
  return fVar8;
}

Assistant:

Float operator()(int index, const bit_array& x) const noexcept
    {
        Float ret = linear_elements[index];

        auto first = indices[index];
        auto last = indices[index + 1];

        for (; first != last; ++first)
            if (x[quadratic_elements[first].id])
                ret += quadratic_elements[first].factor;

        return ret;
    }